

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O0

void psh_blues_scale_zones(PSH_Blues blues,FT_Fixed scale,FT_Pos delta)

{
  bool bVar1;
  FT_Int32 FVar2;
  FT_Int32 b;
  FT_Int32 local_70;
  FT_Pos Delta;
  PSH_Blue_Table family;
  PSH_Blue_Table normal;
  FT_UInt count2;
  FT_UInt count1;
  PSH_Blue_Zone zone2;
  PSH_Blue_Zone zone1;
  PSH_Blue_Zone zone;
  PSH_Blues pPStack_30;
  FT_Int threshold;
  PSH_Blue_Table table;
  FT_UInt num;
  FT_UInt count;
  FT_Pos delta_local;
  FT_Fixed scale_local;
  PSH_Blues blues_local;
  
  if (scale < 0x20c49ba) {
    blues->no_overshoots = scale * 0x7d < blues->blue_scale * 8;
  }
  else {
    blues->no_overshoots = scale < (blues->blue_scale << 3) / 0x7d;
  }
  zone._4_4_ = blues->blue_shift;
  while( true ) {
    bVar1 = false;
    b = (FT_Int32)scale;
    if (0 < zone._4_4_) {
      FVar2 = FT_MulFix_x86_64(zone._4_4_,b);
      bVar1 = 0x20 < FVar2;
    }
    if (!bVar1) break;
    zone._4_4_ = zone._4_4_ + -1;
  }
  blues->blue_threshold = zone._4_4_;
  for (table._0_4_ = 0; (uint)table < 4; table._0_4_ = (uint)table + 1) {
    pPStack_30 = blues;
    if ((uint)table != 0) {
      if ((uint)table == 1) {
        pPStack_30 = (PSH_Blues)&blues->normal_bottom;
      }
      else if ((uint)table == 2) {
        pPStack_30 = (PSH_Blues)&blues->family_top;
      }
      else {
        pPStack_30 = (PSH_Blues)&blues->family_bottom;
      }
    }
    zone1 = (pPStack_30->normal_top).zones;
    for (table._4_4_ = (pPStack_30->normal_top).count; table._4_4_ != 0;
        table._4_4_ = table._4_4_ - 1) {
      FVar2 = FT_MulFix_x86_64(zone1->org_top,b);
      zone1->cur_top = FVar2 + delta;
      FVar2 = FT_MulFix_x86_64(zone1->org_bottom,b);
      zone1->cur_bottom = FVar2 + delta;
      FVar2 = FT_MulFix_x86_64(zone1->org_ref,b);
      zone1->cur_ref = FVar2 + delta;
      FVar2 = FT_MulFix_x86_64(zone1->org_delta,b);
      zone1->cur_delta = (long)FVar2;
      zone1->cur_ref = zone1->cur_ref + 0x20U & 0xffffffffffffffc0;
      zone1 = zone1 + 1;
    }
  }
  table._0_4_ = 0;
  do {
    if (1 < (uint)table) {
      return;
    }
    if ((uint)table == 0) {
      Delta = (FT_Pos)&blues->family_top;
      family = &blues->normal_top;
    }
    else {
      family = &blues->normal_bottom;
      Delta = (FT_Pos)&blues->family_bottom;
    }
    zone2 = family->zones;
    for (normal._4_4_ = family->count; normal._4_4_ != 0; normal._4_4_ = normal._4_4_ - 1) {
      _count2 = (int *)(Delta + 8);
      for (normal._0_4_ = *(int *)Delta; (int)normal != 0; normal._0_4_ = (int)normal + -1) {
        local_70 = zone2->org_ref - *_count2;
        if (local_70 < 0) {
          local_70 = -local_70;
        }
        FVar2 = FT_MulFix_x86_64(local_70,b);
        if (FVar2 < 0x40) {
          zone2->cur_top = *(FT_Pos *)(_count2 + 10);
          zone2->cur_bottom = *(FT_Pos *)(_count2 + 8);
          zone2->cur_ref = *(FT_Pos *)(_count2 + 4);
          zone2->cur_delta = *(FT_Pos *)(_count2 + 6);
          break;
        }
        _count2 = _count2 + 0xc;
      }
      zone2 = zone2 + 1;
    }
    table._0_4_ = (uint)table + 1;
  } while( true );
}

Assistant:

static void
  psh_blues_scale_zones( PSH_Blues  blues,
                         FT_Fixed   scale,
                         FT_Pos     delta )
  {
    FT_UInt         count;
    FT_UInt         num;
    PSH_Blue_Table  table = NULL;

    /*                                                        */
    /* Determine whether we need to suppress overshoots or    */
    /* not.  We simply need to compare the vertical scale     */
    /* parameter to the raw bluescale value.  Here is why:    */
    /*                                                        */
    /*   We need to suppress overshoots for all pointsizes.   */
    /*   At 300dpi that satisfies:                            */
    /*                                                        */
    /*      pointsize < 240*bluescale + 0.49                  */
    /*                                                        */
    /*   This corresponds to:                                 */
    /*                                                        */
    /*      pixelsize < 1000*bluescale + 49/24                */
    /*                                                        */
    /*      scale*EM_Size < 1000*bluescale + 49/24            */
    /*                                                        */
    /*   However, for normal Type 1 fonts, EM_Size is 1000!   */
    /*   We thus only check:                                  */
    /*                                                        */
    /*      scale < bluescale + 49/24000                      */
    /*                                                        */
    /*   which we shorten to                                  */
    /*                                                        */
    /*      "scale < bluescale"                               */
    /*                                                        */
    /* Note that `blue_scale' is stored 1000 times its real   */
    /* value, and that `scale' converts from font units to    */
    /* fractional pixels.                                     */
    /*                                                        */

    /* 1000 / 64 = 125 / 8 */
    if ( scale >= 0x20C49BAL )
      blues->no_overshoots = FT_BOOL( scale < blues->blue_scale * 8 / 125 );
    else
      blues->no_overshoots = FT_BOOL( scale * 125 < blues->blue_scale * 8 );

    /*                                                        */
    /*  The blue threshold is the font units distance under   */
    /*  which overshoots are suppressed due to the BlueShift  */
    /*  even if the scale is greater than BlueScale.          */
    /*                                                        */
    /*  It is the smallest distance such that                 */
    /*                                                        */
    /*    dist <= BlueShift && dist*scale <= 0.5 pixels       */
    /*                                                        */
    {
      FT_Int  threshold = blues->blue_shift;


      while ( threshold > 0 && FT_MulFix( threshold, scale ) > 32 )
        threshold--;

      blues->blue_threshold = threshold;
    }

    for ( num = 0; num < 4; num++ )
    {
      PSH_Blue_Zone  zone;


      switch ( num )
      {
      case 0:
        table = &blues->normal_top;
        break;
      case 1:
        table = &blues->normal_bottom;
        break;
      case 2:
        table = &blues->family_top;
        break;
      default:
        table = &blues->family_bottom;
        break;
      }

      zone  = table->zones;
      count = table->count;
      for ( ; count > 0; count--, zone++ )
      {
        zone->cur_top    = FT_MulFix( zone->org_top,    scale ) + delta;
        zone->cur_bottom = FT_MulFix( zone->org_bottom, scale ) + delta;
        zone->cur_ref    = FT_MulFix( zone->org_ref,    scale ) + delta;
        zone->cur_delta  = FT_MulFix( zone->org_delta,  scale );

        /* round scaled reference position */
        zone->cur_ref = FT_PIX_ROUND( zone->cur_ref );

#if 0
        if ( zone->cur_ref > zone->cur_top )
          zone->cur_ref -= 64;
        else if ( zone->cur_ref < zone->cur_bottom )
          zone->cur_ref += 64;
#endif
      }
    }

    /* process the families now */

    for ( num = 0; num < 2; num++ )
    {
      PSH_Blue_Zone   zone1, zone2;
      FT_UInt         count1, count2;
      PSH_Blue_Table  normal, family;


      switch ( num )
      {
      case 0:
        normal = &blues->normal_top;
        family = &blues->family_top;
        break;

      default:
        normal = &blues->normal_bottom;
        family = &blues->family_bottom;
      }

      zone1  = normal->zones;
      count1 = normal->count;

      for ( ; count1 > 0; count1--, zone1++ )
      {
        /* try to find a family zone whose reference position is less */
        /* than 1 pixel far from the current zone                     */
        zone2  = family->zones;
        count2 = family->count;

        for ( ; count2 > 0; count2--, zone2++ )
        {
          FT_Pos  Delta;


          Delta = zone1->org_ref - zone2->org_ref;
          if ( Delta < 0 )
            Delta = -Delta;

          if ( FT_MulFix( Delta, scale ) < 64 )
          {
            zone1->cur_top    = zone2->cur_top;
            zone1->cur_bottom = zone2->cur_bottom;
            zone1->cur_ref    = zone2->cur_ref;
            zone1->cur_delta  = zone2->cur_delta;
            break;
          }
        }
      }
    }
  }